

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<signed_char>,duckdb::MinOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  MinMaxState<signed_char> *source_00;
  MinMaxState<signed_char> *in_RCX;
  idx_t i;
  MinMaxState<signed_char> **tdata;
  MinMaxState<signed_char> **sdata;
  MinMaxState<signed_char> *target_00;
  
  FlatVector::GetData<duckdb::MinMaxState<signed_char>const*>((Vector *)0xf99d12);
  source_00 = (MinMaxState<signed_char> *)
              FlatVector::GetData<duckdb::MinMaxState<signed_char>*>((Vector *)0xf99d21);
  for (target_00 = (MinMaxState<signed_char> *)0x0; target_00 < in_RCX;
      target_00 = (MinMaxState<signed_char> *)&target_00->isset) {
    MinOperation::Combine<duckdb::MinMaxState<signed_char>,duckdb::MinOperation>
              (source_00,target_00,(AggregateInputData *)0xf99d5d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}